

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphBase.h
# Opt level: O3

double GraphBase::inf_eval(Graph *graph,
                          vector<unsigned_long,_std::allocator<unsigned_long>_> *vecSeed,
                          CascadeModel model,uint32_t evalsize)

{
  uint uVar1;
  pointer puVar2;
  pointer pvVar3;
  pointer ppVar4;
  void *__ptr;
  void *__ptr_00;
  pointer puVar5;
  ostream *poVar6;
  ulong uVar7;
  uint *puVar8;
  uint uVar9;
  size_t __nmemb;
  int iVar10;
  long lVar11;
  long lVar12;
  pair<unsigned_int,_float> *nbr;
  pointer ppVar13;
  undefined1 auVar14 [16];
  double dVar16;
  undefined1 auVar15 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vecActivated;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> Que;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  vector<double,_std::allocator<double>_> vecActivateWeight;
  vector<double,_std::allocator<double>_> vecThr;
  allocator_type local_12d;
  uint32_t local_12c;
  uint *local_128;
  iterator iStack_120;
  uint *local_118;
  double local_108;
  CascadeModel local_fc;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  undefined1 local_a8 [16];
  long local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_88;
  value_type_conflict4 local_80;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  long local_48;
  double local_40;
  Graph *local_38;
  
  local_12c = evalsize;
  local_fc = model;
  local_90 = std::chrono::_V2::system_clock::now();
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (uint *)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (uint *)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (uint *)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (uint *)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_f8,0);
  local_128 = (uint *)0x0;
  iStack_120._M_current = (uint *)0x0;
  local_118 = (uint *)0x0;
  __nmemb = ((long)(graph->
                   super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(graph->
                   super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  lVar11 = (long)(vecSeed->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(vecSeed->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  local_88 = vecSeed;
  __ptr = calloc(__nmemb,1);
  __ptr_00 = calloc(__nmemb,4);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,__nmemb,(allocator_type *)&local_78);
  local_80 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&local_78,__nmemb,&local_80,&local_12d);
  lVar12 = lVar11 >> 3;
  auVar14._8_4_ = (int)(lVar11 >> 0x23);
  auVar14._0_8_ = lVar12;
  auVar14._12_4_ = 0x45300000;
  dVar16 = auVar14._8_8_ - 1.9342813113834067e+25;
  puVar2 = (local_88->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = (local_88->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    *(undefined1 *)((long)__ptr + *puVar5) = 1;
  }
  local_a8._8_4_ = SUB84(dVar16,0);
  local_a8._0_8_ = dVar16 + ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0);
  local_a8._12_4_ = (int)((ulong)dVar16 >> 0x20);
  if (local_12c != 0) {
    local_40 = (double)local_12c;
    uVar9 = 0;
    iVar10 = 0;
    local_38 = graph;
    do {
      if (uVar9 * 100 < iVar10 * local_12c) {
        local_108 = (double)CONCAT44(local_108._4_4_,iVar10);
      }
      else {
        local_48 = std::chrono::_V2::system_clock::now();
        local_108 = (double)(local_48 - local_90) / 1000000000.0;
        if (100.0 < local_108) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\tMC-Progress at: ",0x11);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"%, ",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"time used: ",0xb);
          poVar6 = std::ostream::_M_insert<double>(local_108);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        local_108 = (double)CONCAT44(local_108._4_4_,iVar10 + 0x14);
        local_90 = local_48;
      }
      puVar2 = (local_88->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      for (puVar5 = (local_88->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1)
      {
        local_80 = (value_type_conflict4)CONCAT44(local_80._4_4_,(uint)*puVar5);
        if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<unsigned_int,_std::allocator<unsigned_int>_>::_M_push_back_aux<unsigned_int>
                    ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8,
                     (uint *)&local_80);
        }
        else {
          *local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (uint)*puVar5;
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      if (local_fc == IC) {
        while (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          uVar1 = *local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
          if (local_f8._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_f8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_f8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_f8._M_impl.super__Deque_impl_data._M_start._M_last =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
            local_f8._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_f8._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
          pvVar3 = (graph->
                   super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          ppVar4 = *(pointer *)
                    ((long)&pvVar3[uVar1].
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl.super__Vector_impl_data + 8);
          for (ppVar13 = pvVar3[uVar1].
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar4;
              ppVar13 = ppVar13 + 1) {
            if (*(char *)((long)__ptr + (ulong)ppVar13->first) == '\0') {
              if (0x17d < dsfmt_global_data.idx) {
                dsfmt_gen_rand_all(&dsfmt_global_data);
                dsfmt_global_data.idx = 0;
              }
              iVar10 = dsfmt_global_data.idx + 1;
              lVar11 = (long)dsfmt_global_data.idx;
              dsfmt_global_data.idx = iVar10;
              if (2.0 - dsfmt_global_data.status[0].d[lVar11] <= (double)ppVar13->second) {
                uVar1 = ppVar13->first;
                *(undefined1 *)((long)__ptr + (ulong)uVar1) = 1;
                if (iStack_120._M_current == local_118) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_128,
                             iStack_120,&ppVar13->first);
                }
                else {
                  *iStack_120._M_current = uVar1;
                  iStack_120._M_current = iStack_120._M_current + 1;
                }
                if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<unsigned_int,std::allocator<unsigned_int>>::
                  _M_push_back_aux<unsigned_int_const&>
                            ((deque<unsigned_int,std::allocator<unsigned_int>> *)&local_f8,
                             &ppVar13->first);
                }
                else {
                  *local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar13->first;
                  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
              }
            }
          }
        }
      }
      else if ((local_fc == LT) &&
              (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)) {
        do {
          uVar1 = *local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
          if (local_f8._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_f8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_f8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_f8._M_impl.super__Deque_impl_data._M_start._M_last =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
            local_f8._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_f8._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
          pvVar3 = (graph->
                   super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          ppVar4 = *(pointer *)
                    ((long)&pvVar3[uVar1].
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl.super__Vector_impl_data + 8);
          graph = local_38;
          for (ppVar13 = pvVar3[uVar1].
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; local_38 = graph,
              ppVar13 != ppVar4; ppVar13 = ppVar13 + 1) {
            uVar7 = (ulong)ppVar13->first;
            if (*(char *)((long)__ptr + uVar7) == '\0') {
              if (uVar9 < *(uint *)((long)__ptr_00 + uVar7 * 4)) {
                dVar16 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar7];
              }
              else {
                *(uint *)((long)__ptr_00 + uVar7 * 4) = uVar9 + 1;
                if (0x17d < dsfmt_global_data.idx) {
                  dsfmt_gen_rand_all(&dsfmt_global_data);
                  uVar7 = (ulong)ppVar13->first;
                  dsfmt_global_data.idx = 0;
                }
                lVar11 = (long)dsfmt_global_data.idx;
                dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
                local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7] =
                     2.0 - dsfmt_global_data.status[0].d[lVar11];
                local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7] = 0.0;
                dVar16 = 0.0;
              }
              dVar16 = (double)ppVar13->second + dVar16;
              local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7] = dVar16;
              if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7] <= dVar16) {
                *(undefined1 *)((long)__ptr + uVar7) = 1;
                if (iStack_120._M_current == local_118) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_128,
                             iStack_120,&ppVar13->first);
                }
                else {
                  *iStack_120._M_current = (uint)uVar7;
                  iStack_120._M_current = iStack_120._M_current + 1;
                }
                if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<unsigned_int,std::allocator<unsigned_int>>::
                  _M_push_back_aux<unsigned_int_const&>
                            ((deque<unsigned_int,std::allocator<unsigned_int>> *)&local_f8,
                             &ppVar13->first);
                }
                else {
                  *local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar13->first;
                  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
              }
            }
            graph = local_38;
          }
        } while (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      lVar11 = (long)iStack_120._M_current - (long)local_128 >> 2;
      auVar15._8_4_ = (int)((long)iStack_120._M_current - (long)local_128 >> 0x22);
      auVar15._0_8_ = lVar11;
      auVar15._12_4_ = 0x45300000;
      puVar8 = local_128;
      if (iStack_120._M_current != local_128) {
        do {
          *(undefined1 *)((long)__ptr + (ulong)*puVar8) = 0;
          puVar8 = puVar8 + 1;
        } while (puVar8 != iStack_120._M_current);
        if (local_128 != iStack_120._M_current) {
          iStack_120._M_current = local_128;
        }
      }
      local_a8._0_8_ =
           (double)local_a8._0_8_ +
           ((auVar15._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) / local_40;
      uVar9 = uVar9 + 1;
      iVar10 = local_108._0_4_;
    } while (uVar9 != local_12c);
  }
  free(__ptr);
  free(__ptr_00);
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_128 != (uint *)0x0) {
    operator_delete(local_128,(long)local_118 - (long)local_128);
  }
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_f8);
  return (double)local_a8._0_8_;
}

Assistant:

static double inf_eval(const Graph& graph, const std::vector<size_t>& vecSeed, const CascadeModel model,
                           const uint32_t evalsize = 10000)
    {
        Timer EvalTimer;
//        std::cout << "  >>>Evaluate influence...\n";
        uint32_t nodeId, currProgress = 0;
        std::queue<uint32_t> Que;
        std::vector<uint32_t> vecActivated;

        const auto numV = graph.size();
        auto inf = (double)vecSeed.size();
        bool* activated = (bool *)calloc(numV, sizeof(bool));
        auto* visited = (uint32_t *)calloc(numV, sizeof(uint32_t));
        std::vector<double> vecThr(numV);
        std::vector<double> vecActivateWeight(numV, 0.0);
        for (auto seedId : vecSeed) activated[seedId] = true;
        for (uint32_t i = 0; i < evalsize; i++)
        {
            if (i * 100 >= evalsize * currProgress)
            {
                const auto evalTime = EvalTimer.get_operation_time();
                if (evalTime > 100)
                    std::cout << "\tMC-Progress at: " << currProgress << "%, " <<
                    "time used: " << evalTime << std::endl;
                currProgress += 20;
            }
            for (auto seed : vecSeed)
            {
                Que.push(seed);
            }

            // BFS traversal
            if (model == IC)
            {
                while (!Que.empty())
                {
                    nodeId = Que.front();
                    Que.pop();
                    for (auto& nbr : graph[nodeId])
                    {
                        if (activated[nbr.first]) continue;
                        if (dsfmt_gv_genrand_open_close() <= nbr.second)
                        {
                            activated[nbr.first] = true;
                            vecActivated.push_back(nbr.first);
                            Que.push(nbr.first);
                        }
                    }
                }
            }
            else if (model == LT)
            {
                while (!Que.empty())
                {
                    nodeId = Que.front();
                    Que.pop();
                    for (auto& nbr : graph[nodeId])
                    {
                        if (activated[nbr.first]) continue;
                        if (visited[nbr.first] < i + 1)
                        {
                            // First time visit this node
                            visited[nbr.first] = i + 1;
                            vecThr[nbr.first] = dsfmt_gv_genrand_open_close();
                            vecActivateWeight[nbr.first] = 0.0;
                        }
                        vecActivateWeight[nbr.first] += nbr.second;
                        if (vecActivateWeight[nbr.first] >= vecThr[nbr.first])
                        {
                            // Activation weight is greater than threshold
                            activated[nbr.first] = true;
                            vecActivated.push_back(nbr.first);
                            Que.push(nbr.first);
                        }
                    }
                }
            }
            inf += (double)vecActivated.size() / evalsize;
            for (auto activatedNode : vecActivated) activated[activatedNode] = false;
            vecActivated.clear();
        }
        free(activated);
        free(visited);
//        std::cout << "  >>>MC-Influence spread: " << inf << ", time used (sec): " <<
//        EvalTimer.get_total_time() << std::endl;
        return inf;
    }